

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O2

GLsizei fill_text_data(GLfloat *data,GLubyte *string,GLsizei len)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  byte bVar7;
  uint32_t uVar8;
  double_t dVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar15;
  float fVar17;
  double dVar18;
  double dVar19;
  GLfloat t1;
  GLfloat t0;
  GLfloat s1;
  GLfloat s0;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  undefined8 uVar16;
  
  uVar11 = 0;
  uVar13 = (ulong)(uint)len;
  if (len < 1) {
    uVar13 = uVar11;
  }
  local_48 = 0.5;
  dStack_40 = 0.5;
  iVar12 = 0;
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    bVar7 = string[uVar11];
    uVar8 = font.glyphs[bVar7].codepoint;
    switch(uVar8) {
    case 7:
    case 8:
    case 0xb:
      break;
    case 9:
      local_48 = (double)((float)(((int)(local_48 * 0.015625 + 2.0) / 2) * 2) * 64.0);
      break;
    case 10:
    case 0xd:
      local_48 = 0.0;
      break;
    case 0xc:
      local_48 = 0.0;
      dStack_40 = 0.0;
      break;
    default:
      if (uVar8 != 0x20) {
        s0 = font.glyphs[bVar7].s0;
        t0 = font.glyphs[bVar7].t0;
        s1 = font.glyphs[bVar7].s1;
        t1 = font.glyphs[bVar7].t1;
        dVar9 = getMiddlePixelTex(&s0,&s1,(double)(ulong)(uint)t1);
        local_58._8_4_ = extraout_XMM0_Dc;
        local_58._0_8_ = dVar9;
        local_58._12_4_ = extraout_XMM0_Dd;
        dVar9 = getMiddlePixelTex(&t0,&t1,dVar9);
        iVar10 = iVar12 * 0x18;
        uVar1 = font.glyphs[bVar7].offset_x;
        uVar4 = font.glyphs[bVar7].offset_y;
        dVar18 = ((double)(int)uVar1 + local_48) * 0.015625;
        dVar19 = ((double)(int)uVar4 + dStack_40) * 0.015625;
        fVar15 = (float)dVar18;
        fVar17 = (float)dVar19;
        uVar16 = CONCAT44(fVar17,fVar15);
        *(undefined8 *)(data + iVar10) = uVar16;
        data[iVar10 + 2] = s0;
        data[iVar10 + 3] = t0;
        data[iVar10 + 4] = fVar15;
        data[iVar10 + 6] = s0;
        data[iVar10 + 7] = t1;
        uVar2 = font.glyphs[bVar7].width;
        uVar5 = font.glyphs[bVar7].height;
        fVar15 = (float)(dVar18 + (double)local_58._0_8_ * (double)(int)uVar2 * 0.015625);
        fVar14 = (float)(dVar19 - dVar9 * (double)(int)uVar5 * 0.015625);
        data[iVar10 + 5] = fVar14;
        *(ulong *)(data + (long)iVar10 + 8) = CONCAT44(fVar14,fVar15);
        data[(long)iVar10 + 10] = s1;
        data[(long)iVar10 + 0xb] = t1;
        *(undefined8 *)(data + (long)iVar10 + 0xc) = uVar16;
        data[(long)iVar10 + 0xe] = s0;
        data[(long)iVar10 + 0xf] = t0;
        *(ulong *)(data + (long)iVar10 + 0x10) = CONCAT44(fVar14,fVar15);
        data[(long)iVar10 + 0x12] = s1;
        data[(long)iVar10 + 0x13] = t1;
        data[(long)iVar10 + 0x14] = fVar15;
        data[(long)iVar10 + 0x15] = fVar17;
        data[(long)iVar10 + 0x16] = s1;
        data[(long)iVar10 + 0x17] = t0;
        iVar12 = iVar12 + 1;
      }
    }
    uVar3 = font.glyphs[bVar7].advance_x;
    uVar6 = font.glyphs[bVar7].advance_y;
    local_48 = local_48 + (double)(float)uVar3;
    dStack_40 = dStack_40 + (double)(float)uVar6;
  }
  return iVar12;
}

Assistant:

static GLsizei fill_text_data(GLfloat* data,
                              const GLubyte* string,
                              GLsizei len)
{
	double pen_x = 0.5; // position in pixel
	double pen_y = 0.5;
	double x,y,w,h;

	GLsizei num = 0;
	for(GLsizei i=0; i<len; i++) {
		const texture_glyph_t *glyph = font.glyphs + string[i];

		switch(glyph->codepoint) {
			// up, semi-up, semi-down...  x01 - 06, e1 - e6, c0 -df, f0 - ff  could mean something
			case '\f':  // back to the beginning
				pen_y = 0;
				/* FALLTHRU */
			case '\n':  // newline
			case '\r':  // carriage return
				pen_x = 0;
				/* FALLTHRU */
			case ' ':   // space
			case '\a':  // goes up :-)
			case '\v':  // vertical space
			case '\b':  // back the size of a space
				break;
			case '\t':  // tab
				pen_x = ((int) (pen_x/font.size + 2) / 2) * 2 * font.size;
				break;
			default:
				x = (pen_x + glyph->offset_x)/font.size;
				y = (pen_y + glyph->offset_y)/font.size;

				GLfloat s0 = glyph->s0, s1 = glyph->s1;
				GLfloat t0 = glyph->t0, t1 = glyph->t1;

				double rx = getMiddlePixelTex(&s0, &s1, font.tex_width);
				double ry = getMiddlePixelTex(&t0, &t1, font.tex_height);

				w = glyph->width*rx/font.size;
				h = glyph->height*ry/font.size;

				data[24*num + 0] = (GLfloat) x;
				data[24*num + 1] = (GLfloat) y;
				data[24*num + 2] = s0;
				data[24*num + 3] = t0;
				data[24*num + 4] = (GLfloat) x;
				data[24*num + 5] = (GLfloat) (y - h);
				data[24*num + 6] = s0;
				data[24*num + 7] = t1;
				data[24*num + 8] = (GLfloat) (x + w);
				data[24*num + 9] = (GLfloat) (y - h);
				data[24*num + 10] = s1;
				data[24*num + 11] = t1;
				data[24*num + 12] = (GLfloat) x;
				data[24*num + 13] = (GLfloat) y;
				data[24*num + 14] = s0;
				data[24*num + 15] = t0;
				data[24*num + 16] = (GLfloat) (x + w);
				data[24*num + 17] = (GLfloat) (y - h);
				data[24*num + 18] = s1;
				data[24*num + 19] = t1;
				data[24*num + 20] = (GLfloat) (x + w);
				data[24*num + 21] = (GLfloat) y;
				data[24*num + 22] = s1;
				data[24*num + 23] = t0;

				num++;
				break;

		}
		pen_x += glyph->advance_x;
		pen_y += glyph->advance_y;
	}

	return num;
}